

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_stereo_filter(OggOpusFile *_of,void *_dst,int _dst_sz,op_sample *_src,int _nsamples,
                    int _nchannels)

{
  op_sample oVar1;
  int local_4c;
  int local_48;
  float local_44;
  int ci;
  float r;
  float l;
  int i;
  float *dst;
  int _nchannels_local;
  int _nsamples_local;
  op_sample *_src_local;
  int _dst_sz_local;
  void *_dst_local;
  OggOpusFile *_of_local;
  
  local_4c = _dst_sz >> 1;
  if (_nsamples < local_4c) {
    local_4c = _nsamples;
  }
  if (_nchannels == 2) {
    memcpy(_dst,_src,(long)(local_4c << 1) << 2);
  }
  else if (_nchannels == 1) {
    for (r = 0.0; (int)r < local_4c; r = (float)((int)r + 1)) {
      oVar1 = _src[(int)r];
      *(op_sample *)((long)_dst + (long)((int)r * 2 + 1) * 4) = oVar1;
      *(op_sample *)((long)_dst + (long)((int)r << 1) * 4) = oVar1;
    }
  }
  else {
    for (r = 0.0; (int)r < local_4c; r = (float)((int)r + 1)) {
      local_44 = 0.0;
      ci = 0;
      for (local_48 = 0; local_48 < _nchannels; local_48 = local_48 + 1) {
        ci = (int)(OP_STEREO_DOWNMIX[_nchannels + -3][local_48][0] *
                   _src[_nchannels * (int)r + local_48] + (float)ci);
        local_44 = *(float *)((long)(_nchannels + -3) * 0x40 + 0x118664 + (long)local_48 * 8) *
                   _src[_nchannels * (int)r + local_48] + local_44;
      }
      *(int *)((long)_dst + (long)((int)r << 1) * 4) = ci;
      *(float *)((long)_dst + (long)((int)r * 2 + 1) * 4) = local_44;
    }
  }
  return local_4c;
}

Assistant:

static int op_stereo_filter(OggOpusFile *_of,void *_dst,int _dst_sz,
 op_sample *_src,int _nsamples,int _nchannels){
  (void)_of;
  _nsamples=OP_MIN(_nsamples,_dst_sz>>1);
  if(_nchannels==2)memcpy(_dst,_src,_nsamples*2*sizeof(*_src));
  else{
    float *dst;
    int    i;
    dst=(float *)_dst;
    if(_nchannels==1){
      for(i=0;i<_nsamples;i++)dst[2*i+0]=dst[2*i+1]=_src[i];
    }
    else{
      for(i=0;i<_nsamples;i++){
        float l;
        float r;
        int   ci;
        l=r=0;
        for(ci=0;ci<_nchannels;ci++){
          l+=OP_STEREO_DOWNMIX[_nchannels-3][ci][0]*_src[_nchannels*i+ci];
          r+=OP_STEREO_DOWNMIX[_nchannels-3][ci][1]*_src[_nchannels*i+ci];
        }
        dst[2*i+0]=l;
        dst[2*i+1]=r;
      }
    }
  }
  return _nsamples;
}